

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion.h
# Opt level: O2

string * __thiscall
Conversion::convert_to_voacb_base_abi_cxx11_
          (string *__return_storage_ptr__,Conversion *this,BigInt *num_decimal_base)

{
  char cVar1;
  pointer pcVar2;
  bool bVar3;
  longlong lVar4;
  long lVar5;
  int i;
  ulong uVar6;
  longlong base;
  BigInt local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  base = (this->indexToChar)._M_string_length;
  while( true ) {
    BigInt::BigInt(&local_1d8,0);
    bVar3 = BigInt::operator<(&local_1d8,num_decimal_base);
    std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
              ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_1d8);
    if (!bVar3) break;
    lVar4 = BigInt::operator%(num_decimal_base,base);
    std::operator<<(local_1a8,(this->indexToChar)._M_dataplus._M_p[lVar4]);
    BigInt::operator/=(num_decimal_base,&base);
  }
  std::__cxx11::stringbuf::str();
  lVar5 = -1;
  for (uVar6 = 0; uVar6 < __return_storage_ptr__->_M_string_length >> 1; uVar6 = uVar6 + 1) {
    pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = pcVar2[uVar6];
    pcVar2[uVar6] = pcVar2[lVar5 + __return_storage_ptr__->_M_string_length];
    (__return_storage_ptr__->_M_dataplus)._M_p[lVar5 + __return_storage_ptr__->_M_string_length] =
         cVar1;
    lVar5 = lVar5 + -1;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

string Conversion::convert_to_voacb_base(BigInt num_decimal_base) {
    stringstream ss;
    long long base = indexToChar.size();
    //! div and mod by base
  /*  while (num_decimal_base > BigInt(0)) {
        ss << indexToChar[num_decimal_base % base];
        num_decimal_base /= base;
    }*/

    for (; num_decimal_base > BigInt(0); num_decimal_base /= base)
        ss << indexToChar[num_decimal_base % base]; //! pushing least significant first which is obtained by mod

    string result = ss.str();
    char temp;
    //! reverse
    for (int i = 0; i < result.size() / 2; i++) {
        temp = result[i];
        result[i] = result[result.size() - 1 - i];
        result[result.size() - 1 - i] = temp;
    }
    return result;
}